

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O3

void __thiscall QWidgetLineControl::moveCursor(QWidgetLineControl *this,int pos,bool mark)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  commitPreedit(this);
  iVar5 = pos;
  if ((*(int *)(this + 0x40) != pos) &&
     (this[0x50] = (QWidgetLineControl)((byte)this[0x50] | 2), *(long *)(this + 0xe8) != 0)) {
    if (*(int *)(this + 0x40) < pos) {
      iVar5 = nextMaskBlank(this,pos);
    }
    else {
      iVar5 = findInMask(this,pos,false,false,(QChar)0x0);
      *(ushort *)(this + 0x50) =
           (*(ushort *)(this + 0x50) & 0xfffd) +
           (ushort)(byte)((byte)((*(ushort *)(this + 0x50) & 2) >> 1) | iVar5 != pos) * 2;
      if (iVar5 == -1) {
        iVar5 = 0;
      }
    }
  }
  iVar6 = *(int *)(this + 0x110);
  iVar1 = *(int *)(this + 0x114);
  if (mark) {
    iVar2 = *(int *)(this + 0x40);
    iVar3 = iVar2;
    if (iVar2 == iVar1) {
      iVar3 = iVar6;
    }
    if (iVar1 <= iVar6) {
      iVar3 = iVar2;
    }
    iVar7 = iVar3;
    if (iVar2 == iVar6) {
      iVar7 = iVar1;
    }
    if (iVar1 <= iVar6) {
      iVar7 = iVar3;
    }
    iVar6 = iVar5;
    if (iVar7 < iVar5) {
      iVar6 = iVar7;
    }
    *(int *)(this + 0x110) = iVar6;
    if (iVar7 <= iVar5) {
      iVar7 = iVar5;
    }
    *(int *)(this + 0x114) = iVar7;
    updateDisplayText(this,false);
    *(int *)(this + 0x40) = iVar5;
    uVar4 = *(ushort *)(this + 0x50) & 0xff7f;
  }
  else {
    bVar8 = -1 < (char)*(ushort *)(this + 0x50);
    uVar4 = *(ushort *)(this + 0x50) & 0xff7f;
    *(ushort *)(this + 0x50) = uVar4 | (ushort)(!bVar8 || iVar6 < iVar1) << 7;
    *(undefined8 *)(this + 0x110) = 0;
    *(int *)(this + 0x40) = iVar5;
    if (bVar8 && iVar1 <= iVar6) goto LAB_00424685;
  }
  *(ushort *)(this + 0x50) = uVar4;
  QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)0x0);
LAB_00424685:
  emitCursorPositionChanged(this);
  return;
}

Assistant:

void QWidgetLineControl::moveCursor(int pos, bool mark)
{
    commitPreedit();

    if (pos != m_cursor) {
        separate();
        if (m_maskData)
            pos = pos > m_cursor ? nextMaskBlank(pos) : prevMaskBlank(pos);
    }
    if (mark) {
        int anchor;
        if (m_selend > m_selstart && m_cursor == m_selstart)
            anchor = m_selend;
        else if (m_selend > m_selstart && m_cursor == m_selend)
            anchor = m_selstart;
        else
            anchor = m_cursor;
        m_selstart = qMin(anchor, pos);
        m_selend = qMax(anchor, pos);
        updateDisplayText();
    } else {
        internalDeselect();
    }
    m_cursor = pos;
    if (mark || m_selDirty) {
        m_selDirty = false;
        emit selectionChanged();
    }
    emitCursorPositionChanged();
}